

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db_00;
  char *z;
  sqlite3 *db;
  sqlite3_str str;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  str._24_8_ = argv;
  db_00 = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit((StrAccum *)&db,db_00,(char *)0x0,0,db_00->aLimit[0]);
  sqlite3QuoteValue((StrAccum *)&db,*(sqlite3_value **)str._24_8_);
  z = sqlite3StrAccumFinish((StrAccum *)&db);
  sqlite3_result_text(context,z,str.nAlloc,sqlite3OomClear);
  if ((byte)str.mxAlloc != 0) {
    sqlite3_result_null(context);
    sqlite3_result_error_code(context,(uint)(byte)str.mxAlloc);
  }
  return;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  sqlite3_str str;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  sqlite3QuoteValue(&str,argv[0]);
  sqlite3_result_text(context, sqlite3StrAccumFinish(&str), str.nChar,
                      SQLITE_DYNAMIC);
  if( str.accError!=SQLITE_OK ){
    sqlite3_result_null(context);
    sqlite3_result_error_code(context, str.accError);
  }
}